

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeDee.cpp
# Opt level: O2

int TeeDee::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  EffectData *pEVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_a8;
  float local_a0;
  float local_68;
  
  pEVar4 = UnityAudioEffectState::GetEffectData<TeeDee::EffectData>(state);
  fVar18 = (float)(state->field_0).field_0.samplerate;
  fVar1 = (pEVar4->field_0).data.p[7];
  local_68 = 1.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_68 = powf(0.01,1.0 / (fVar1 * fVar18));
  }
  fVar1 = (pEVar4->field_0).data.p[8];
  fVar21 = 1.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar21 = powf(0.01,1.0 / (fVar1 * fVar18));
  }
  fVar1 = (pEVar4->field_0).data.p[9];
  local_a8 = 0.0;
  local_a0 = 1.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_a0 = powf(0.01,1.0 / (fVar1 * fVar18));
  }
  uVar12 = (state->field_0).field_0.flags;
  if ((uVar12 & 1) != 0) {
    if ((uVar12 & 6) == 0) {
      local_a8 = 1.0;
    }
    else {
      local_a8 = 0.0;
    }
  }
  fVar1 = (pEVar4->field_0).data.p[0x10];
  fVar19 = (fVar18 * 0.25 * 60.0) / (pEVar4->field_0).data.p[1];
  uVar5 = (ulong)fVar19;
  uVar5 = (long)(fVar19 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  uVar7 = 0;
  uVar9 = 0;
  if (0 < outchannels) {
    uVar9 = (ulong)(uint)outchannels;
  }
  uVar12 = 0;
  for (uVar11 = 0; uVar11 != length; uVar11 = uVar11 + 1) {
    uVar6 = (state->field_0).field_0.currdsptick + uVar11;
    if ((uVar6 % uVar5 == 0) &&
       (iVar10 = (int)((uVar6 / uVar5) % (ulong)(long)(int)(pEVar4->field_0).data.p[0x11]),
       (pEVar4->field_0).data.pattern_index = iVar10,
       *(int *)((long)&pEVar4->field_0 + (long)iVar10 * 4) != 0)) {
      *(undefined8 *)((long)&pEVar4->field_0 + 0x104) =
           *(undefined8 *)((long)&pEVar4->field_0 + 0x14c);
      (pEVar4->field_0).data.penv = (pEVar4->field_0).data.p[0xe];
    }
    fVar19 = (pEVar4->field_0).data.penv;
    fVar14 = ((pEVar4->field_0).data.p[6] + fVar19) * (1.0 / fVar18) + (pEVar4->field_0).data.phase;
    fVar15 = floorf(fVar14);
    fVar14 = fVar14 - (float)(int)fVar15;
    (pEVar4->field_0).data.phase = fVar14;
    uVar3 = *(undefined8 *)((long)&pEVar4->field_0 + 0x104);
    *(ulong *)((long)&pEVar4->field_0 + 0x104) =
         CONCAT44((float)((ulong)uVar3 >> 0x20) * fVar21 + 1e-11,(float)uVar3 * local_68 + 1e-11);
    (pEVar4->field_0).data.penv = fVar19 * local_a0 + 1e-11;
    fVar14 = sinf((fVar14 + fVar14) * 3.1415927);
    fVar19 = (pEVar4->field_0).data.p[2];
    fVar15 = Random::GetFloat(&(pEVar4->field_0).data.random,-1.0,1.0);
    fVar15 = atanf((fVar15 * (pEVar4->field_0).data.p[3] + fVar14 * fVar19) *
                   (pEVar4->field_0).data.p[0xf]);
    fVar19 = (pEVar4->field_0).data.aenv;
    fVar16 = (pEVar4->field_0).data.p[4] + (pEVar4->field_0).data.fenv;
    fVar14 = 0.0;
    if ((0.0 <= fVar16) && (fVar14 = fVar16, fVar18 * 0.5 < fVar16)) {
      fVar14 = fVar18 * 0.5;
    }
    fVar16 = sinf(fVar14 * 1.5707964 * (1.0 / fVar18));
    fVar17 = 1.0 - (pEVar4->field_0).data.p[5];
    fVar14 = 1.4;
    if (fVar16 + fVar16 <= 1.4) {
      fVar14 = fVar16 + fVar16;
    }
    fVar16 = (pEVar4->field_0).data.bpf;
    fVar2 = (pEVar4->field_0).data.wetmix;
    fVar20 = fVar14 * fVar16 + (pEVar4->field_0).data.lpf;
    (pEVar4->field_0).data.lpf = fVar20;
    fVar19 = (fVar15 * 0.31830987 * fVar19 - fVar20) - fVar17 * fVar17 * fVar16;
    (pEVar4->field_0).data.bpf = fVar14 * fVar19 + fVar16;
    (pEVar4->field_0).data.wetmix = (local_a8 - fVar2) * 0.05 + 1e-09 + fVar2;
    fVar14 = atanf(((fVar19 - fVar20) * (pEVar4->field_0).data.p[10] + fVar20) *
                   (pEVar4->field_0).data.p[0xb]);
    fVar19 = (pEVar4->field_0).data.aenv;
    iVar10 = (int)uVar7;
    uVar6 = uVar9;
    uVar8 = uVar12;
    while( true ) {
      bVar13 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar13) break;
      fVar15 = inbuffer[uVar7];
      outbuffer[uVar8] =
           ((fVar15 * fVar1 * 0.01 + fVar14 * 0.31830987 * fVar19) - fVar15) *
           (pEVar4->field_0).data.wetmix + fVar15;
      uVar8 = uVar8 + 1;
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    uVar12 = uVar12 + outchannels;
    uVar7 = (ulong)(uint)(iVar10 + inchannels);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float sr = (float)state->samplerate;
        float st = 1.0f / sr;
        float sr_half = sr * 0.5f;
        float adecay = (data->p[P_ADECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_ADECAY]));
        float fdecay = (data->p[P_FDECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_FDECAY]));
        float pdecay = (data->p[P_PDECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_PDECAY]));
        float wetTarget = ((state->flags & UnityAudioEffectStateFlags_IsPlaying) && !(state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused))) ? 1.0f : 0.0f;
        float inputmix = data->p[P_INPUTMIX] * 0.01f;
        UInt64 pattern_length = (UInt64)(sr * 0.25f * 60.0f / data->p[P_BPM]);
        for (unsigned int n = 0; n < length; n++)
        {
            if (((state->currdsptick + n) % pattern_length) == 0)
            {
                data->pattern_index = ((state->currdsptick + n) / pattern_length) % (int)data->p[P_NUMSTEPS];
                if (data->pattern[data->pattern_index])
                {
                    data->aenv = data->p[P_AENV];
                    data->fenv = data->p[P_FENV];
                    data->penv = data->p[P_PENV];
                }
            }
            data->phase += (data->p[P_FREQ] + data->penv) * st;
            data->phase -= FastFloor(data->phase);
            data->aenv = data->aenv * adecay + 1.0e-11f;
            data->fenv = data->fenv * fdecay + 1.0e-11f;
            data->penv = data->penv * pdecay + 1.0e-11f;
            float outval = sinf(data->phase * 2.0f * kPI) * data->p[P_SINE] + data->random.GetFloat(-1.0f, 1.0f) * data->p[P_NOISE];
            outval = atanf(outval * data->p[P_PREDIST]) * (1.0f / kPI) * data->aenv;
            float cut = data->p[P_CUT] + data->fenv;
            if (cut < 0.0f)
                cut = 0.0f;
            else if (cut > sr_half)
                cut = sr_half;
            cut = 2.0f * sinf(0.5f * kPI * cut * st);
            if (cut > 1.4f)
                cut = 1.4f;
            float bw = 1.0f - data->p[P_RES]; bw *= bw;
            data->lpf += cut * data->bpf;
            float hpf = outval - data->lpf - data->bpf * bw;
            data->bpf += cut * hpf;
            data->wetmix += (wetTarget - data->wetmix) * 0.05f + 1.0e-9f;
            outval = data->lpf + (hpf - data->lpf) * data->p[P_FILTERTYPE];
            outval = atanf(outval * data->p[P_POSTDIST]) * (1.0f / kPI) * data->aenv;
            for (int i = 0; i < outchannels; i++)
            {
                float inval = inbuffer[n * inchannels + i];
                outbuffer[n * outchannels + i] = inval + (outval + inval * inputmix - inval) * data->wetmix;
            }
        }

        return UNITY_AUDIODSP_OK;
    }